

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestContext::TestContext(TestContext *this)

{
  Vat *pVVar1;
  Client local_58;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30 [2];
  TestContext *local_10;
  TestContext *this_local;
  
  local_10 = this;
  kj::EventLoop::EventLoop(&this->loop);
  kj::WaitScope::WaitScope(&this->waitScope,&this->loop);
  TestNetwork::TestNetwork(&this->network);
  TestRestorer::TestRestorer(&this->restorer);
  kj::
  HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
  ::HashMap(&this->vats);
  kj::StringPtr::StringPtr((StringPtr *)local_30,"alice");
  pVVar1 = getVat(this,(StringPtr)local_30[0]);
  this->alice = pVVar1;
  kj::StringPtr::StringPtr((StringPtr *)&local_40,"bob");
  capnproto_test::capnp::test::TestInterface::Client::Client(&local_58,&(this->restorer).cap);
  pVVar1 = initVat<capnproto_test::capnp::test::TestInterface::Client>
                     (this,(StringPtr)local_40,&local_58);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_58);
  this->bob = pVVar1;
  return;
}

Assistant:

TestContext()
      : waitScope(loop),
        alice(getVat("alice")),
        bob(initVat("bob", restorer.cap)) {}